

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<crnlib::vector<unsigned_char>_>::push_back
          (vector<crnlib::vector<unsigned_char>_> *this,vector<unsigned_char> *obj)

{
  vector<unsigned_char> *pvVar1;
  uint uVar2;
  uint uVar3;
  vector<unsigned_char> *pvVar4;
  
  if (this->m_capacity <= this->m_size) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,this->m_size + 1,true,0x10,(object_mover)0x0,false);
  }
  pvVar4 = this->m_p;
  uVar2 = this->m_size;
  pvVar1 = pvVar4 + uVar2;
  pvVar1->m_p = (uchar *)0x0;
  pvVar1->m_size = 0;
  pvVar1->m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)(pvVar4 + uVar2),obj->m_size,false,1,(object_mover)0x0,false);
  uVar3 = obj->m_size;
  pvVar4[uVar2].m_size = uVar3;
  memcpy(pvVar4[uVar2].m_p,obj->m_p,(ulong)uVar3);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

inline void push_back(const T& obj)
        {
            CRNLIB_ASSERT(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

            if (m_size >= m_capacity)
            {
                increase_capacity(m_size + 1, true);
            }

            scalar_type<T>::construct(m_p + m_size, obj);
            m_size++;
        }